

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O0

void cpptempl::parse_tree(token_vector *tokens,token_vector *tree,TokenType until)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  int in_EDX;
  token_vector *in_RSI;
  vector<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
  *in_RDI;
  token_vector children_1;
  token_vector children;
  token_ptr token;
  vector<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
  *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  value_type *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  const_iterator in_stack_ffffffffffffff58;
  value_type local_80;
  shared_ptr<cpptempl::Token> local_68;
  shared_ptr<cpptempl::Token> *local_50;
  shared_ptr<cpptempl::Token> *local_38;
  TokenType in_stack_ffffffffffffffe4;
  undefined4 in_stack_ffffffffffffffe8;
  
  do {
    bVar1 = std::
            vector<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
            ::empty((vector<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
                     *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return;
    }
    std::
    vector<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>::
    operator[](in_RDI,0);
    std::shared_ptr<cpptempl::Token>::shared_ptr
              ((shared_ptr<cpptempl::Token> *)
               CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
               (shared_ptr<cpptempl::Token> *)in_stack_ffffffffffffff38);
    local_38 = (shared_ptr<cpptempl::Token> *)
               std::
               vector<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
               ::begin(in_stack_ffffffffffffff38);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<cpptempl::Token>const*,std::vector<std::shared_ptr<cpptempl::Token>,std::allocator<std::shared_ptr<cpptempl::Token>>>>
    ::__normal_iterator<std::shared_ptr<cpptempl::Token>*>
              ((__normal_iterator<const_std::shared_ptr<cpptempl::Token>_*,_std::vector<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>_>
                *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
               (__normal_iterator<std::shared_ptr<cpptempl::Token>_*,_std::vector<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>_>
                *)in_stack_ffffffffffffff38);
    local_50 = (shared_ptr<cpptempl::Token> *)
               std::
               vector<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
               ::erase((vector<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
                        *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                       in_stack_ffffffffffffff58);
    peVar3 = std::__shared_ptr_access<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x204226);
    iVar2 = (**peVar3->_vptr_Token)();
    if (iVar2 == 4) {
      in_stack_ffffffffffffff58._M_current = &local_68;
      std::
      vector<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>::
      vector((vector<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
              *)0x204253);
      parse_tree(in_RSI,(token_vector *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                 in_stack_ffffffffffffffe4);
      peVar3 = std::__shared_ptr_access<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x204279);
      (*peVar3->_vptr_Token[2])(peVar3,&local_68);
      std::
      vector<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>::
      ~vector((vector<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
               *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
LAB_002043ab:
      std::
      vector<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>::
      push_back((vector<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
                 *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                in_stack_ffffffffffffff48);
      bVar1 = false;
    }
    else {
      peVar3 = std::__shared_ptr_access<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2042e4);
      in_stack_ffffffffffffff54 = (**peVar3->_vptr_Token)();
      if (in_stack_ffffffffffffff54 == 3) {
        in_stack_ffffffffffffff48 = &local_80;
        std::
        vector<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
        ::vector((vector<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
                  *)0x20430d);
        parse_tree(in_RSI,(token_vector *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                   in_stack_ffffffffffffffe4);
        peVar3 = std::__shared_ptr_access<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x204333);
        (*peVar3->_vptr_Token[2])(peVar3,&local_80);
        std::
        vector<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
        ::~vector((vector<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
                   *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
        goto LAB_002043ab;
      }
      peVar3 = std::__shared_ptr_access<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<cpptempl::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x20437f);
      in_stack_ffffffffffffff44 = (**peVar3->_vptr_Token)();
      if (in_stack_ffffffffffffff44 != in_EDX) goto LAB_002043ab;
      bVar1 = true;
    }
    std::shared_ptr<cpptempl::Token>::~shared_ptr((shared_ptr<cpptempl::Token> *)0x2043d7);
    if (bVar1) {
      return;
    }
  } while( true );
}

Assistant:

inline void parse_tree(token_vector &tokens, token_vector &tree, TokenType until)
    {
        while(! tokens.empty())
        {
            // 'pops' first item off list
            token_ptr token = tokens[0] ;
            tokens.erase(tokens.begin()) ;

            if (token->gettype() == TOKEN_TYPE_FOR)
            {
                token_vector children ;
                parse_tree(tokens, children, TOKEN_TYPE_ENDFOR) ;
                token->set_children(children) ;
            }
            else if (token->gettype() == TOKEN_TYPE_IF)
            {
                token_vector children ;
                parse_tree(tokens, children, TOKEN_TYPE_ENDIF) ;
                token->set_children(children) ;
            }
            else if (token->gettype() == until)
            {
                return ;
            }
            tree.push_back(token) ;
        }
    }